

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterWriteDTDEntity
              (xmlTextWriterPtr writer,int pe,xmlChar *name,xmlChar *pubid,xmlChar *sysid,
              xmlChar *ndataid,xmlChar *content)

{
  int iVar1;
  
  if ((((sysid != (xmlChar *)0x0) || (pubid != (xmlChar *)0x0)) || (content != (xmlChar *)0x0)) &&
     (pe == 0 || ndataid == (xmlChar *)0x0)) {
    if (pubid == (xmlChar *)0x0 && sysid == (xmlChar *)0x0) {
      iVar1 = xmlTextWriterWriteDTDInternalEntity(writer,pe,name,content);
      return iVar1;
    }
    iVar1 = xmlTextWriterWriteDTDExternalEntity(writer,pe,name,pubid,sysid,ndataid);
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlTextWriterWriteDTDEntity(xmlTextWriterPtr writer,
                            int pe,
                            const xmlChar * name,
                            const xmlChar * pubid,
                            const xmlChar * sysid,
                            const xmlChar * ndataid,
                            const xmlChar * content)
{
    if ((content == NULL) && (pubid == NULL) && (sysid == NULL))
        return -1;
    if ((pe != 0) && (ndataid != NULL))
        return -1;

    if ((pubid == NULL) && (sysid == NULL))
        return xmlTextWriterWriteDTDInternalEntity(writer, pe, name,
                                                   content);

    return xmlTextWriterWriteDTDExternalEntity(writer, pe, name, pubid,
                                               sysid, ndataid);
}